

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

void Vector3OrthoNormalize(Vector3 *v1,Vector3 *v2)

{
  Vector3 VVar1;
  Vector3 VVar2;
  
  VVar1 = Vector3Normalize(*v1);
  *v1 = VVar1;
  VVar2 = Vector3CrossProduct(VVar1,*v2);
  VVar2 = Vector3Normalize(VVar2);
  VVar1 = Vector3CrossProduct(VVar2,VVar1);
  *v2 = VVar1;
  return;
}

Assistant:

RMDEF void Vector3OrthoNormalize(Vector3 *v1, Vector3 *v2)
{
    *v1 = Vector3Normalize(*v1);
    Vector3 vn = Vector3CrossProduct(*v1, *v2);
    vn = Vector3Normalize(vn);
    *v2 = Vector3CrossProduct(vn, *v1);
}